

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcRestruct.c
# Opt level: O3

int Abc_NodeResubMffc(Abc_ManRst_t *p,Vec_Ptr_t *vDecs,int nLeaves,Abc_Obj_t *pRoot)

{
  undefined4 uVar1;
  long *plVar2;
  int iVar3;
  int *__s;
  void **ppvVar4;
  uint uVar5;
  uint uVar6;
  ulong uVar7;
  ulong extraout_RDX;
  ulong extraout_RDX_00;
  ulong extraout_RDX_01;
  ulong extraout_RDX_02;
  long lVar8;
  ulong uVar9;
  Abc_Ntk_t *pAVar10;
  Vec_Ptr_t *pVVar11;
  ulong uVar12;
  int iVar13;
  
  uVar7 = (ulong)(uint)nLeaves;
  pAVar10 = pRoot->pNtk;
  if ((pAVar10->vTravIds).pArray == (int *)0x0) {
    iVar3 = pAVar10->vObjs->nSize;
    uVar12 = (long)iVar3 + 500;
    iVar13 = (int)uVar12;
    if ((pAVar10->vTravIds).nCap < iVar13) {
      __s = (int *)malloc(uVar12 * 4);
      (pAVar10->vTravIds).pArray = __s;
      if (__s == (int *)0x0) {
        __assert_fail("p->pArray",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                      ,0x20c,"void Vec_IntGrow(Vec_Int_t *, int)");
      }
      (pAVar10->vTravIds).nCap = iVar13;
      uVar7 = extraout_RDX;
    }
    else {
      __s = (int *)0x0;
    }
    if (-500 < iVar3) {
      memset(__s,0,(uVar12 & 0xffffffff) << 2);
      uVar7 = extraout_RDX_00;
    }
    (pAVar10->vTravIds).nSize = iVar13;
  }
  iVar13 = (int)uVar7;
  iVar3 = pAVar10->nTravIds;
  pAVar10->nTravIds = iVar3 + 1;
  if (0x3ffffffe < iVar3) {
    __assert_fail("p->nTravIds < (1<<30)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abc.h"
                  ,0x197,"void Abc_NtkIncrementTravId(Abc_Ntk_t *)");
  }
  uVar12 = (ulong)(uint)nLeaves;
  if (0 < nLeaves) {
    uVar9 = 0;
    do {
      if ((long)vDecs->nSize <= (long)uVar9) goto LAB_00297089;
      lVar8 = *vDecs->pArray[uVar9];
      iVar3 = (int)*(long *)((long)vDecs->pArray[uVar9] + 0x10);
      uVar1 = *(undefined4 *)(lVar8 + 0xd8);
      Vec_IntFillExtra((Vec_Int_t *)(lVar8 + 0xe0),iVar3 + 1,(int)uVar7);
      iVar13 = (int)extraout_RDX_01;
      if (((long)iVar3 < 0) || (*(int *)(lVar8 + 0xe4) <= iVar3)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                      ,0x1c0,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
      }
      *(undefined4 *)(*(long *)(lVar8 + 0xe8) + (long)iVar3 * 4) = uVar1;
      uVar9 = uVar9 + 1;
      uVar7 = extraout_RDX_01;
    } while (uVar12 != uVar9);
    pAVar10 = pRoot->pNtk;
  }
  iVar3 = pRoot->Id;
  Vec_IntFillExtra(&pAVar10->vTravIds,iVar3 + 1,iVar13);
  if (((long)iVar3 < 0) || ((pAVar10->vTravIds).nSize <= iVar3)) {
LAB_0029706a:
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                  ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
  }
  if ((pAVar10->vTravIds).pArray[iVar3] != pRoot->pNtk->nTravIds + -1) {
    __assert_fail("Abc_NodeIsTravIdPrevious(pRoot)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcRestruct.c"
                  ,0x497,"int Abc_NodeResubMffc(Abc_ManRst_t *, Vec_Ptr_t *, int, Abc_Obj_t *)");
  }
  iVar3 = Abc_NodeResubMffc_rec(pRoot);
  p->vTemp->nSize = 0;
  if (nLeaves < vDecs->nSize) {
    uVar5 = 0;
    uVar7 = extraout_RDX_02;
    do {
      if (nLeaves < 0) {
LAB_00297089:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      plVar2 = (long *)vDecs->pArray[uVar12];
      lVar8 = *plVar2;
      iVar13 = (int)plVar2[2];
      Vec_IntFillExtra((Vec_Int_t *)(lVar8 + 0xe0),iVar13 + 1,(int)uVar7);
      if (((long)iVar13 < 0) || (*(int *)(lVar8 + 0xe4) <= iVar13)) goto LAB_0029706a;
      if (*(int *)(*(long *)(lVar8 + 0xe8) + (long)iVar13 * 4) == *(int *)(*plVar2 + 0xd8)) {
        pVVar11 = p->vTemp;
        uVar6 = pVVar11->nSize;
        if (uVar6 == pVVar11->nCap) {
          if ((int)uVar6 < 0x10) {
            if (pVVar11->pArray == (void **)0x0) {
              ppvVar4 = (void **)malloc(0x80);
            }
            else {
              ppvVar4 = (void **)realloc(pVVar11->pArray,0x80);
            }
            pVVar11->pArray = ppvVar4;
            pVVar11->nCap = 0x10;
          }
          else {
            if (pVVar11->pArray == (void **)0x0) {
              ppvVar4 = (void **)malloc((ulong)uVar6 << 4);
            }
            else {
              ppvVar4 = (void **)realloc(pVVar11->pArray,(ulong)uVar6 << 4);
            }
            pVVar11->pArray = ppvVar4;
            pVVar11->nCap = uVar6 * 2;
          }
        }
        else {
          ppvVar4 = pVVar11->pArray;
        }
        iVar13 = pVVar11->nSize;
        uVar6 = iVar13 + 1;
        uVar7 = (ulong)uVar6;
        pVVar11->nSize = uVar6;
        ppvVar4[iVar13] = plVar2;
        iVar13 = vDecs->nSize;
      }
      else {
        if (((int)uVar5 < 0) || (iVar13 = vDecs->nSize, iVar13 <= (int)uVar5)) goto LAB_002970a8;
        uVar7 = (ulong)uVar5;
        uVar5 = uVar5 + 1;
        vDecs->pArray[uVar7] = plVar2;
      }
      uVar12 = uVar12 + 1;
      if (iVar13 <= (int)uVar12) goto code_r0x00296fcf;
    } while( true );
  }
  if (p->vDecs->nSize != 0) goto LAB_00297152;
LAB_00297133:
  __assert_fail("p->nSize > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                ,0x1b7,"void *Vec_PtrEntryLast(Vec_Ptr_t *)");
code_r0x00296fcf:
  pVVar11 = p->vTemp;
  if (0 < pVVar11->nSize) {
    lVar8 = 0;
    do {
      if (((int)uVar5 < 0) || (iVar13 <= (int)(uVar5 + (int)lVar8))) {
LAB_002970a8:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                      ,0x1a6,"void Vec_PtrWriteEntry(Vec_Ptr_t *, int, void *)");
      }
      vDecs->pArray[(ulong)uVar5 + lVar8] = pVVar11->pArray[lVar8];
      lVar8 = lVar8 + 1;
      pVVar11 = p->vTemp;
    } while (lVar8 < pVVar11->nSize);
    uVar5 = uVar5 + (int)lVar8;
  }
  if (uVar5 != p->vDecs->nSize) {
LAB_00297152:
    __assert_fail("k == Vec_PtrSize(p->vDecs)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcRestruct.c"
                  ,0x4a4,"int Abc_NodeResubMffc(Abc_ManRst_t *, Vec_Ptr_t *, int, Abc_Obj_t *)");
  }
  if (0 < (int)uVar5) {
    if ((Abc_Obj_t *)p->vDecs->pArray[(ulong)uVar5 - 1] == pRoot) {
      return iVar3;
    }
    __assert_fail("pRoot == Vec_PtrEntryLast(p->vDecs)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcRestruct.c"
                  ,0x4a5,"int Abc_NodeResubMffc(Abc_ManRst_t *, Vec_Ptr_t *, int, Abc_Obj_t *)");
  }
  goto LAB_00297133;
}

Assistant:

int Abc_NodeResubMffc( Abc_ManRst_t * p, Vec_Ptr_t * vDecs, int nLeaves, Abc_Obj_t * pRoot )
{
    Abc_Obj_t * pObj;
    int Counter, i, k;
    // increment the traversal ID for the leaves
    Abc_NtkIncrementTravId( pRoot->pNtk );
    // label the leaves
    Vec_PtrForEachEntryStop( Abc_Obj_t *, vDecs, pObj, i, nLeaves )
        Abc_NodeSetTravIdCurrent( pObj ); 
    // make sure the node is in the cone and is no one of the leaves
    assert( Abc_NodeIsTravIdPrevious(pRoot) );
    Counter = Abc_NodeResubMffc_rec( pRoot );
    // move the labeled nodes to the end 
    Vec_PtrClear( p->vTemp );
    k = 0;
    Vec_PtrForEachEntryStart( Abc_Obj_t *, vDecs, pObj, i, nLeaves )
        if ( Abc_NodeIsTravIdCurrent(pObj) )
            Vec_PtrPush( p->vTemp, pObj );
        else
            Vec_PtrWriteEntry( vDecs, k++, pObj );
    // add the labeled nodes
    Vec_PtrForEachEntry( Abc_Obj_t *, p->vTemp, pObj, i )
        Vec_PtrWriteEntry( vDecs, k++, pObj );
    assert( k == Vec_PtrSize(p->vDecs) );
    assert( pRoot == Vec_PtrEntryLast(p->vDecs) );
    return Counter;
}